

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

parasail_result_t * parasail_result_new_trace(int a,int b,size_t alignment,size_t size)

{
  parasail_result_t *ppVar1;
  parasail_result_extra_trace_t *ppVar2;
  void *pvVar3;
  
  if ((a < 1) || (b < 1)) {
    fprintf(_stderr,"%s: inputs must be > 0\n","parasail_result_new_trace");
    return (parasail_result_t *)0x0;
  }
  ppVar1 = parasail_result_new();
  if (ppVar1 != (parasail_result_t *)0x0) {
    ppVar2 = (parasail_result_extra_trace_t *)malloc(0x18);
    (ppVar1->field_4).trace = ppVar2;
    if (ppVar2 == (parasail_result_extra_trace_t *)0x0) {
      fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_trace",0x18);
      return (parasail_result_t *)0x0;
    }
    pvVar3 = parasail_memalign(alignment,(ulong)(uint)b * (ulong)(uint)a * size);
    ppVar2->trace_table = pvVar3;
    if (pvVar3 != (void *)0x0) {
      ppVar2->trace_ins_table = (void *)0x0;
      ppVar2->trace_del_table = (void *)0x0;
      return ppVar1;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* parasail_result_new_trace(const int a, const int b, const size_t alignment, const size_t size)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    VALIDATE_A_B

    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;

    PARASAIL_NEW(result->trace, parasail_result_extra_trace_t);
    result->trace->trace_table = parasail_memalign(alignment, size*a*b);
    if (!result->trace->trace_table) return NULL;
    result->trace->trace_ins_table = NULL;
    result->trace->trace_del_table = NULL;

    return result;
}